

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::GenerateGraphViz(cmake *this,char *fileName)

{
  cmGraphVizWriter *this_00;
  char *pcVar1;
  auto_ptr<cmGraphVizWriter> gvWriter;
  string fallbackSettingsFile;
  string settingsFile;
  allocator local_61;
  auto_ptr<cmGraphVizWriter> local_60;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  this_00 = (cmGraphVizWriter *)operator_new(0x108);
  cmGraphVizWriter::cmGraphVizWriter(this_00,&this->GlobalGenerator->LocalGenerators);
  local_60.x_ = this_00;
  pcVar1 = cmState::GetBinaryDirectory(this->State);
  std::__cxx11::string::string((string *)local_38,pcVar1,(allocator *)local_58);
  std::__cxx11::string::append((char *)local_38);
  pcVar1 = cmState::GetSourceDirectory(this->State);
  std::__cxx11::string::string((string *)local_58,pcVar1,&local_61);
  std::__cxx11::string::append((char *)local_58);
  cmGraphVizWriter::ReadSettings(local_60.x_,(char *)local_38[0],(char *)local_58[0]);
  cmGraphVizWriter::WritePerTargetFiles(local_60.x_,fileName);
  cmGraphVizWriter::WriteTargetDependersFiles(local_60.x_,fileName);
  cmGraphVizWriter::WriteGlobalFile(local_60.x_,fileName);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  ::cm::auto_ptr<cmGraphVizWriter>::~auto_ptr(&local_60);
  return;
}

Assistant:

void cmake::GenerateGraphViz(const char* fileName) const
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  CM_AUTO_PTR<cmGraphVizWriter> gvWriter(
    new cmGraphVizWriter(this->GetGlobalGenerator()->GetLocalGenerators()));

  std::string settingsFile = this->GetHomeOutputDirectory();
  settingsFile += "/CMakeGraphVizOptions.cmake";
  std::string fallbackSettingsFile = this->GetHomeDirectory();
  fallbackSettingsFile += "/CMakeGraphVizOptions.cmake";

  gvWriter->ReadSettings(settingsFile.c_str(), fallbackSettingsFile.c_str());

  gvWriter->WritePerTargetFiles(fileName);
  gvWriter->WriteTargetDependersFiles(fileName);
  gvWriter->WriteGlobalFile(fileName);

#endif
}